

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool closed,float thickness)

{
  float *pfVar1;
  ImDrawVert *pIVar2;
  ImVec4 *pIVar3;
  uint uVar4;
  ImDrawIdx IVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  ImVec2 IVar11;
  int iVar12;
  ImDrawIdx *pIVar13;
  ulong uVar14;
  ImDrawIdx IVar15;
  undefined7 in_register_00000081;
  long lVar16;
  long lVar17;
  ImU32 IVar18;
  ImDrawIdx IVar19;
  ImDrawIdx IVar20;
  uint uVar21;
  ulong uVar22;
  float *pfVar23;
  byte bVar24;
  ImDrawIdx IVar25;
  bool bVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float afStack_b8 [2];
  undefined8 uStack_b0;
  ImVec2 IStack_a8;
  ImVec2 local_a0;
  undefined1 local_98 [8];
  ImVec2 IStack_90;
  float local_84;
  float local_80;
  int local_7c;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ImVec2 local_60;
  long local_58;
  uint local_4c;
  ulong local_48;
  undefined4 local_3c;
  ImU32 local_38;
  float local_34;
  
  if (1 < points_count) {
    uVar8 = (ulong)(uint)points_count;
    local_60 = this->_Data->TexUvWhitePixel;
    local_a0 = (ImVec2)(ulong)(points_count - 1U);
    uVar6 = points_count - 1U;
    if (closed) {
      uVar6 = points_count;
    }
    uVar22 = (ulong)uVar6;
    if ((this->Flags & 1U) == 0) {
      uStack_b0 = 0x14b373;
      local_98._0_4_ = thickness;
      PrimReserve(this,uVar6 * 6,uVar6 * 4);
      if (0 < (int)uVar6) {
        fVar29 = (float)local_98._0_4_ * 0.5;
        lVar16 = -uVar22;
        uVar22 = 1;
        local_98._0_4_ = fVar29;
        IVar11 = local_60;
        local_78 = uVar8;
        local_58 = lVar16;
        do {
          uVar14 = uVar22;
          if (uVar8 == uVar22) {
            uVar14 = 0;
          }
          fVar33 = points[uVar14].x - points[uVar22 - 1].x;
          local_34 = points[uVar14].y - points[uVar22 - 1].y;
          fVar27 = fVar33 * fVar33 + local_34 * local_34;
          if (0.0 < fVar27) {
            if (fVar27 < 0.0) {
              local_48 = CONCAT44(local_48._4_4_,fVar33);
              uStack_b0 = 0x14b410;
              fVar27 = sqrtf(fVar27);
              IVar11 = local_60;
              uVar8 = local_78;
              lVar16 = local_58;
              fVar29 = (float)local_98._0_4_;
              fVar33 = (float)local_48;
            }
            else {
              fVar27 = SQRT(fVar27);
            }
            fVar33 = fVar33 * (1.0 / fVar27);
            local_34 = local_34 * (1.0 / fVar27);
          }
          fVar33 = fVar33 * fVar29;
          local_34 = local_34 * fVar29;
          pIVar2 = this->_VtxWritePtr;
          (pIVar2->pos).x = points[uVar22 - 1].x + local_34;
          (pIVar2->pos).y = points[uVar22 - 1].y - fVar33;
          pIVar2->uv = IVar11;
          pIVar2 = this->_VtxWritePtr;
          pIVar2->col = col;
          pIVar2[1].pos.x = points[uVar14].x + local_34;
          pIVar2[1].pos.y = points[uVar14].y - fVar33;
          pIVar2[1].uv = IVar11;
          pIVar2 = this->_VtxWritePtr;
          pIVar2[1].col = col;
          pIVar2[2].pos.x = points[uVar14].x - local_34;
          pIVar2[2].pos.y = points[uVar14].y + fVar33;
          pIVar2[2].uv = IVar11;
          pIVar2 = this->_VtxWritePtr;
          pIVar2[2].col = col;
          pIVar2[3].pos.x = points[uVar22 - 1].x - local_34;
          pIVar2[3].pos.y = fVar33 + points[uVar22 - 1].y;
          pIVar2[3].uv = IVar11;
          pIVar2 = this->_VtxWritePtr;
          pIVar2[3].col = col;
          this->_VtxWritePtr = pIVar2 + 4;
          uVar6 = this->_VtxCurrentIdx;
          pIVar13 = this->_IdxWritePtr;
          IVar5 = (ImDrawIdx)uVar6;
          *pIVar13 = IVar5;
          pIVar13[1] = IVar5 + 1;
          pIVar13[2] = IVar5 + 2;
          pIVar13[3] = IVar5;
          pIVar13[4] = IVar5 + 2;
          pIVar13[5] = IVar5 + 3;
          this->_IdxWritePtr = pIVar13 + 6;
          this->_VtxCurrentIdx = uVar6 + 4;
          lVar17 = lVar16 + uVar22;
          uVar22 = uVar22 + 1;
        } while (lVar17 != 0);
      }
    }
    else {
      local_3c = (undefined4)CONCAT71(in_register_00000081,closed);
      local_84 = thickness;
      if (thickness <= 1.0) {
        local_84 = 1.0;
      }
      local_7c = (int)local_84;
      local_80 = local_84 - (float)local_7c;
      bVar24 = local_80 <= 1e-05 & local_7c < 0x3f & (byte)this->Flags >> 1;
      iVar12 = 0x12;
      if (thickness <= 1.0) {
        iVar12 = 0xc;
      }
      local_4c = points_count * 3;
      if (1.0 < thickness) {
        local_4c = points_count * 4;
      }
      iVar10 = 6;
      if (bVar24 == 0) {
        iVar10 = iVar12;
      }
      if (bVar24 != 0) {
        local_4c = points_count * 2;
      }
      uStack_b0 = 0x14b5ed;
      local_38 = col;
      local_58._0_1_ = thickness <= 1.0;
      PrimReserve(this,iVar10 * uVar6,local_4c);
      local_34 = (float)CONCAT31(local_34._1_3_,bVar24);
      local_58._0_1_ = (byte)local_58 | bVar24;
      lVar16 = -((ulong)(((uint)((byte)local_58 ^ 1) * 2 + 3) * points_count) * 8 + 0xf &
                0xfffffffffffffff0);
      pfVar23 = (float *)((long)&IStack_a8 + lVar16);
      local_68 = uVar8;
      uVar8 = (ulong)(uint)points_count;
      local_70 = uVar22;
      local_48 = uVar8;
      if (0 < (int)uVar6) {
        uVar14 = 1;
        do {
          uVar7 = uVar14;
          if (uVar8 == uVar14) {
            uVar7 = 0;
          }
          local_98._0_4_ = points[uVar7].x - points[uVar14 - 1].x;
          fVar29 = points[uVar7].y - points[uVar14 - 1].y;
          fVar33 = (float)local_98._0_4_ * (float)local_98._0_4_ + fVar29 * fVar29;
          if (0.0 < fVar33) {
            if (fVar33 < 0.0) {
              _local_98 = ZEXT416((uint)local_98._0_4_);
              local_78 = CONCAT44(local_78._4_4_,fVar29);
              *(undefined8 *)((long)&uStack_b0 + lVar16) = 0x14b6af;
              fVar33 = sqrtf(fVar33);
              uVar8 = local_48;
              fVar29 = (float)local_78;
            }
            else {
              fVar33 = SQRT(fVar33);
            }
            local_98._0_4_ = (float)local_98._0_4_ * (1.0 / fVar33);
            fVar29 = fVar29 * (1.0 / fVar33);
          }
          *(float *)((long)&uStack_b0 + uVar14 * 8 + lVar16) = fVar29;
          *(float *)((long)&uStack_b0 + uVar14 * 8 + lVar16 + 4) = -(float)local_98._0_4_;
          bVar26 = uVar14 != uVar22;
          uVar14 = uVar14 + 1;
        } while (bVar26);
      }
      pfVar1 = pfVar23 + uVar8 * 2;
      if ((char)local_3c == '\0') {
        *(undefined8 *)(pfVar23 + ((ulong)local_a0 & 0xffffffff) * 2) = *(undefined8 *)(pfVar1 + -4)
        ;
      }
      IVar18 = local_38;
      IVar11 = local_60;
      uVar6 = local_38 & 0xffffff;
      fVar29 = 1.0;
      if ((byte)local_58 == '\0') {
        fVar29 = (local_84 + -1.0) * 0.5;
        uVar21 = (uint)local_68;
        if ((char)local_3c == '\0') {
          fVar28 = fVar29 + 1.0;
          fVar33 = *(float *)((long)&IStack_a8 + lVar16 + 4);
          fVar32 = fVar28 * *pfVar23;
          fVar34 = fVar28 * fVar33;
          fVar27 = points->x;
          fVar31 = points->y;
          fVar30 = *pfVar23 * fVar29;
          fVar33 = fVar33 * fVar29;
          *pfVar1 = fVar32 + fVar27;
          pfVar1[1] = fVar34 + fVar31;
          pfVar1[2] = fVar30 + fVar27;
          pfVar1[3] = fVar33 + fVar31;
          pfVar1[4] = fVar27 - fVar30;
          pfVar1[5] = fVar31 - fVar33;
          pfVar1[6] = fVar27 - fVar32;
          pfVar1[7] = fVar31 - fVar34;
          uVar22 = (ulong)local_a0 & 0xffffffff;
          fVar33 = points[uVar22].x;
          fVar27 = points[uVar22].y;
          uVar14 = (ulong)(uint)((int)local_a0.x << 2);
          *(ulong *)(pfVar1 + uVar14 * 2) =
               CONCAT44(*(float *)((long)&IStack_a8 + uVar22 * 8 + lVar16 + 4) * fVar28 + fVar27,
                        pfVar23[uVar22 * 2] * fVar28 + fVar33);
          *(ulong *)(pfVar1 + uVar14 * 2 + 2) =
               CONCAT44(*(float *)((long)&IStack_a8 + uVar22 * 8 + lVar16 + 4) * fVar29 + fVar27,
                        pfVar23[uVar22 * 2] * fVar29 + fVar33);
          *(ulong *)(pfVar1 + uVar14 * 2 + 4) =
               CONCAT44(fVar27 - *(float *)((long)&IStack_a8 + uVar22 * 8 + lVar16 + 4) * fVar29,
                        fVar33 - pfVar23[uVar22 * 2] * fVar29);
          *(ulong *)(pfVar1 + uVar14 * 2 + 6) =
               CONCAT44(fVar27 - fVar28 * *(float *)((long)&IStack_a8 + uVar22 * 8 + lVar16 + 4),
                        fVar33 - pfVar23[uVar22 * 2] * fVar28);
        }
        if (0 < (int)local_70) {
          pIVar13 = this->_IdxWritePtr;
          uVar22 = 1;
          uVar21 = this->_VtxCurrentIdx;
          do {
            uVar14 = uVar22 & 0xffffffff;
            if (uVar8 == uVar22) {
              uVar14 = 0;
            }
            fVar27 = (*(float *)((long)&uStack_b0 + uVar22 * 8 + lVar16) + pfVar23[uVar14 * 2]) *
                     0.5;
            fVar31 = (*(float *)((long)&uStack_b0 + uVar22 * 8 + lVar16 + 4) +
                     *(float *)((long)&IStack_a8 + uVar14 * 8 + lVar16 + 4)) * 0.5;
            fVar28 = fVar27 * fVar27 + fVar31 * fVar31;
            fVar33 = 0.5;
            if (0.5 <= fVar28) {
              fVar33 = fVar28;
            }
            uVar9 = uVar21 + 4;
            if (uVar8 == uVar22) {
              uVar9 = this->_VtxCurrentIdx;
            }
            fVar27 = fVar27 * (1.0 / fVar33);
            fVar31 = (1.0 / fVar33) * fVar31;
            fVar32 = (fVar29 + 1.0) * fVar27;
            fVar30 = (fVar29 + 1.0) * fVar31;
            fVar27 = fVar27 * fVar29;
            uVar8 = (ulong)(uint)((int)uVar14 << 2);
            fVar33 = points[uVar14].x;
            fVar31 = fVar31 * fVar29;
            pfVar1[uVar8 * 2] = fVar33 + fVar32;
            fVar28 = points[uVar14].y;
            pfVar1[uVar8 * 2 + 1] = fVar28 + fVar30;
            pfVar1[uVar8 * 2 + 2] = fVar33 + fVar27;
            pfVar1[uVar8 * 2 + 3] = fVar28 + fVar31;
            pfVar1[uVar8 * 2 + 4] = fVar33 - fVar27;
            pfVar1[uVar8 * 2 + 5] = fVar28 - fVar31;
            pfVar1[uVar8 * 2 + 6] = fVar33 - fVar32;
            IVar5 = (ImDrawIdx)uVar9;
            IVar20 = IVar5 + 1;
            pfVar1[uVar8 * 2 + 7] = fVar28 - fVar30;
            *pIVar13 = IVar20;
            IVar19 = (ImDrawIdx)uVar21;
            IVar25 = IVar19 + 2;
            pIVar13[1] = IVar19 + 1;
            pIVar13[2] = IVar25;
            pIVar13[3] = IVar25;
            IVar15 = IVar5 + 2;
            pIVar13[4] = IVar15;
            pIVar13[5] = IVar20;
            pIVar13[6] = IVar20;
            pIVar13[7] = IVar19 + 1;
            pIVar13[8] = IVar19;
            pIVar13[9] = IVar19;
            pIVar13[10] = IVar5;
            pIVar13[0xb] = IVar20;
            pIVar13[0xc] = IVar15;
            pIVar13[0xd] = IVar25;
            pIVar13[0xe] = IVar19 + 3;
            pIVar13[0xf] = IVar19 + 3;
            pIVar13[0x10] = IVar5 + 3;
            pIVar13[0x11] = IVar15;
            pIVar13 = pIVar13 + 0x12;
            bVar26 = uVar22 != (local_70 & 0xffffffff);
            uVar22 = uVar22 + 1;
            uVar8 = local_48;
            uVar21 = uVar9;
          } while (bVar26);
          this->_IdxWritePtr = pIVar13;
          uVar21 = (uint)local_68;
          IVar11 = local_60;
          IVar18 = local_38;
        }
        uVar22 = 1;
        if (1 < (int)uVar21) {
          uVar22 = (ulong)uVar21;
        }
        lVar16 = 0;
        do {
          this->_VtxWritePtr->pos = *(ImVec2 *)((long)pfVar23 + lVar16 + uVar8 * 8);
          this->_VtxWritePtr->uv = IVar11;
          pIVar2 = this->_VtxWritePtr;
          pIVar2->col = uVar6;
          pIVar2[1].pos = *(ImVec2 *)((long)pfVar23 + lVar16 + uVar8 * 8 + 8);
          this->_VtxWritePtr[1].uv = IVar11;
          pIVar2 = this->_VtxWritePtr;
          pIVar2[1].col = IVar18;
          pIVar2[2].pos = *(ImVec2 *)((long)pfVar23 + lVar16 + uVar8 * 8 + 0x10);
          this->_VtxWritePtr[2].uv = IVar11;
          pIVar2 = this->_VtxWritePtr;
          pIVar2[2].col = IVar18;
          pIVar2[3].pos = *(ImVec2 *)((long)pfVar23 + lVar16 + uVar8 * 8 + 0x18);
          this->_VtxWritePtr[3].uv = IVar11;
          pIVar2 = this->_VtxWritePtr;
          pIVar2[3].col = uVar6;
          this->_VtxWritePtr = pIVar2 + 4;
          lVar16 = lVar16 + 0x20;
        } while (uVar22 * 0x20 != lVar16);
      }
      else {
        if (local_34._0_1_ != '\0') {
          fVar29 = local_84 * 0.5 + 1.0;
        }
        if ((char)local_3c == '\0') {
          fVar33 = *pfVar23;
          fVar28 = *(float *)((long)&IStack_a8 + lVar16 + 4) * fVar29;
          fVar27 = points->x;
          fVar31 = points->y;
          *pfVar1 = fVar33 * fVar29 + fVar27;
          pfVar1[1] = fVar28 + fVar31;
          pfVar1[2] = fVar27 - fVar33 * fVar29;
          pfVar1[3] = fVar31 - fVar28;
          uVar8 = (ulong)local_a0 & 0xffffffff;
          fVar33 = points[uVar8].x;
          fVar27 = points[uVar8].y;
          uVar22 = (ulong)(uint)((int)local_a0.x * 2);
          *(ulong *)(pfVar1 + uVar22 * 2) =
               CONCAT44(*(float *)((long)&IStack_a8 + uVar8 * 8 + lVar16 + 4) * fVar29 + fVar27,
                        pfVar23[uVar8 * 2] * fVar29 + fVar33);
          *(ulong *)(pfVar1 + uVar22 * 2 + 2) =
               CONCAT44(fVar27 - *(float *)((long)&IStack_a8 + uVar8 * 8 + lVar16 + 4) * fVar29,
                        fVar33 - pfVar23[uVar8 * 2] * fVar29);
        }
        if (0 < (int)local_70) {
          uVar9 = (uint)local_34 & 0xff;
          pIVar13 = this->_IdxWritePtr;
          uVar8 = 1;
          uVar21 = this->_VtxCurrentIdx;
          do {
            uVar22 = uVar8 & 0xffffffff;
            uVar4 = uVar21 + (uVar9 ^ 3);
            if (local_48 == uVar8) {
              uVar22 = 0;
              uVar4 = this->_VtxCurrentIdx;
            }
            fVar27 = (*(float *)((long)&uStack_b0 + uVar8 * 8 + lVar16) + pfVar23[uVar22 * 2]) * 0.5
            ;
            fVar31 = (*(float *)((long)&uStack_b0 + uVar8 * 8 + lVar16 + 4) +
                     *(float *)((long)&IStack_a8 + uVar22 * 8 + lVar16 + 4)) * 0.5;
            fVar28 = fVar27 * fVar27 + fVar31 * fVar31;
            fVar33 = 0.5;
            if (0.5 <= fVar28) {
              fVar33 = fVar28;
            }
            fVar30 = fVar27 * (1.0 / fVar33) * fVar29;
            uVar14 = (ulong)(uint)((int)uVar22 * 2);
            fVar27 = points[uVar22].x;
            pfVar1[uVar14 * 2] = fVar27 + fVar30;
            fVar28 = points[uVar22].y;
            fVar33 = (1.0 / fVar33) * fVar31 * fVar29;
            pfVar1[uVar14 * 2 + 1] = fVar28 + fVar33;
            pfVar1[uVar14 * 2 + 2] = fVar27 - fVar30;
            pfVar1[uVar14 * 2 + 3] = fVar28 - fVar33;
            IVar19 = (ImDrawIdx)uVar4;
            *pIVar13 = IVar19;
            IVar5 = (ImDrawIdx)uVar21;
            pIVar13[1] = IVar5;
            if (local_34._0_1_ == '\0') {
              pIVar13[2] = IVar5 + 2;
              pIVar13[3] = IVar5 + 2;
              pIVar13[4] = IVar19 + 2;
              pIVar13[5] = IVar19;
              pIVar13[6] = IVar19 + 1;
              pIVar13[7] = IVar5 + 1;
              pIVar13[8] = IVar5;
              pIVar13[9] = IVar5;
              pIVar13[10] = IVar19;
              pIVar13[0xb] = IVar19 + 1;
              lVar17 = 0x18;
            }
            else {
              pIVar13[2] = IVar5 + 1;
              pIVar13[3] = IVar19 + 1;
              pIVar13[4] = IVar5 + 1;
              pIVar13[5] = IVar19;
              lVar17 = 0xc;
            }
            pIVar13 = (ImDrawIdx *)((long)pIVar13 + lVar17);
            this->_IdxWritePtr = pIVar13;
            bVar26 = uVar8 != (local_70 & 0xffffffff);
            uVar8 = uVar8 + 1;
            uVar21 = uVar4;
          } while (bVar26);
        }
        if (local_34._0_1_ == '\0') {
          uVar8 = 1;
          if (1 < (int)local_68) {
            uVar8 = local_68 & 0xffffffff;
          }
          lVar16 = 0;
          do {
            this->_VtxWritePtr->pos = *(ImVec2 *)((long)&points->x + lVar16);
            this->_VtxWritePtr->uv = local_60;
            pIVar2 = this->_VtxWritePtr;
            pIVar2->col = local_38;
            pIVar2[1].pos = *(ImVec2 *)((long)pfVar23 + lVar16 * 2 + local_48 * 8);
            this->_VtxWritePtr[1].uv = local_60;
            pIVar2 = this->_VtxWritePtr;
            pIVar2[1].col = uVar6;
            pIVar2[2].pos = *(ImVec2 *)((long)pfVar23 + lVar16 * 2 + local_48 * 8 + 8);
            this->_VtxWritePtr[2].uv = local_60;
            pIVar2 = this->_VtxWritePtr;
            pIVar2[2].col = uVar6;
            this->_VtxWritePtr = pIVar2 + 3;
            lVar16 = lVar16 + 8;
          } while (uVar8 * 8 != lVar16);
        }
        else {
          pIVar3 = this->_Data->TexUvLines;
          lVar16 = (long)local_7c;
          fVar29 = pIVar3[lVar16].x;
          fVar33 = pIVar3[lVar16].y;
          fVar27 = pIVar3[lVar16].z;
          fVar31 = pIVar3[lVar16].w;
          if ((local_80 != 0.0) || (NAN(local_80))) {
            fVar29 = fVar29 + (pIVar3[lVar16 + 1].x - fVar29) * local_80;
            fVar33 = fVar33 + (pIVar3[lVar16 + 1].y - fVar33) * local_80;
            fVar27 = fVar27 + (pIVar3[lVar16 + 1].z - fVar27) * local_80;
            fVar31 = fVar31 + (pIVar3[lVar16 + 1].w - fVar31) * local_80;
          }
          uVar8 = 1;
          if (1 < (int)local_68) {
            uVar8 = local_68 & 0xffffffff;
          }
          lVar16 = 0;
          do {
            this->_VtxWritePtr->pos = *(ImVec2 *)((long)pfVar23 + lVar16 + local_48 * 8);
            pIVar2 = this->_VtxWritePtr;
            (pIVar2->uv).x = fVar29;
            (pIVar2->uv).y = fVar33;
            pIVar2 = this->_VtxWritePtr;
            pIVar2->col = local_38;
            pIVar2[1].pos = *(ImVec2 *)((long)pfVar23 + lVar16 + local_48 * 8 + 8);
            pIVar2 = this->_VtxWritePtr;
            pIVar2[1].uv.x = fVar27;
            pIVar2[1].uv.y = fVar31;
            pIVar2 = this->_VtxWritePtr;
            pIVar2[1].col = local_38;
            this->_VtxWritePtr = pIVar2 + 2;
            lVar16 = lVar16 + 0x10;
          } while (uVar8 * 0x10 != lVar16);
        }
      }
      this->_VtxCurrentIdx = this->_VtxCurrentIdx + (local_4c & 0xffff);
    }
  }
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 opaque_uv = _Data->TexUvWhitePixel;
    const int count = closed ? points_count : points_count - 1; // The number of line segments we need to draw
    const bool thick_line = (thickness > 1.0f);

    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = 1.0f;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        // Thicknesses <1.0 should behave like thickness 1.0
        thickness = ImMax(thickness, 1.0f);
        const int integer_thickness = (int)thickness;
        const float fractional_thickness = thickness - integer_thickness;

        // Do we want to draw this line using a texture?
        // - For now, only draw integer-width lines using textures to avoid issues with the way scaling occurs, could be improved.
        // - If AA_SIZE is not 1.0f we cannot use the texture path.
        const bool use_texture = (Flags & ImDrawListFlags_AntiAliasedLinesUseTex) && (integer_thickness < IM_DRAWLIST_TEX_LINES_WIDTH_MAX) && (fractional_thickness <= 0.00001f);

        // We should never hit this, because NewFrame() doesn't set ImDrawListFlags_AntiAliasedLinesUseTex unless ImFontAtlasFlags_NoBakedLines is off
        IM_ASSERT_PARANOID(!use_texture || !(_Data->Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines));

        const int idx_count = use_texture ? (count * 6) : (thick_line ? count * 18 : count * 12);
        const int vtx_count = use_texture ? (points_count * 2) : (thick_line ? points_count * 4 : points_count * 3);
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        // The first <points_count> items are normals at each line point, then after that there are either 2 or 4 temp points for each line point
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * ((use_texture || !thick_line) ? 3 : 5) * sizeof(ImVec2)); //-V630
        ImVec2* temp_points = temp_normals + points_count;

        // Calculate normals (tangents) for each line segment
        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count - 1] = temp_normals[points_count - 2];

        // If we are drawing a one-pixel-wide line without a texture, or a textured line of any width, we only need 2 or 3 vertices per point
        if (use_texture || !thick_line)
        {
            // [PATH 1] Texture-based lines (thick or non-thick)
            // [PATH 2] Non texture-based lines (non-thick)

            // The width of the geometry we need to draw - this is essentially <thickness> pixels for the line itself, plus "one pixel" for AA.
            // - In the texture-based path, we don't use AA_SIZE here because the +1 is tied to the generated texture
            //   (see ImFontAtlasBuildRenderLinesTexData() function), and so alternate values won't work without changes to that code.
            // - In the non texture-based paths, we would allow AA_SIZE to potentially be != 1.0f with a patch (e.g. fringe_scale patch to
            //   allow scaling geometry while preserving one-screen-pixel AA fringe).
            const float half_draw_size = use_texture ? ((thickness * 0.5f) + 1) : AA_SIZE;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * half_draw_size;
                temp_points[1] = points[0] - temp_normals[0] * half_draw_size;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * half_draw_size;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * half_draw_size;
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1; // i2 is the second point of the line segment
                const unsigned int idx2 = ((i1 + 1) == points_count) ? _VtxCurrentIdx : (idx1 + (use_texture ? 2 : 3)); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                dm_x *= half_draw_size; // dm_x, dm_y are offset to the outer edge of the AA area
                dm_y *= half_draw_size;

                // Add temporary vertexes for the outer edges
                ImVec2* out_vtx = &temp_points[i2 * 2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                if (use_texture)
                {
                    // Add indices for two triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 1); // Right tri
                    _IdxWritePtr[3] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[4] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Left tri
                    _IdxWritePtr += 6;
                }
                else
                {
                    // Add indexes for four triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 2); // Right tri 1
                    _IdxWritePtr[3] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Right tri 2
                    _IdxWritePtr[6] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8] = (ImDrawIdx)(idx1 + 0); // Left tri 1
                    _IdxWritePtr[9] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1); // Left tri 2
                    _IdxWritePtr += 12;
                }

                idx1 = idx2;
            }

            // Add vertexes for each point on the line
            if (use_texture)
            {
                // If we're using textures we only need to emit the left/right edge vertices
                ImVec4 tex_uvs = _Data->TexUvLines[integer_thickness];
                if (fractional_thickness != 0.0f)
                {
                    const ImVec4 tex_uvs_1 = _Data->TexUvLines[integer_thickness + 1];
                    tex_uvs.x = tex_uvs.x + (tex_uvs_1.x - tex_uvs.x) * fractional_thickness; // inlined ImLerp()
                    tex_uvs.y = tex_uvs.y + (tex_uvs_1.y - tex_uvs.y) * fractional_thickness;
                    tex_uvs.z = tex_uvs.z + (tex_uvs_1.z - tex_uvs.z) * fractional_thickness;
                    tex_uvs.w = tex_uvs.w + (tex_uvs_1.w - tex_uvs.w) * fractional_thickness;
                }
                ImVec2 tex_uv0(tex_uvs.x, tex_uvs.y);
                ImVec2 tex_uv1(tex_uvs.z, tex_uvs.w);
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = temp_points[i * 2 + 0]; _VtxWritePtr[0].uv = tex_uv0; _VtxWritePtr[0].col = col; // Left-side outer edge
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 1]; _VtxWritePtr[1].uv = tex_uv1; _VtxWritePtr[1].col = col; // Right-side outer edge
                    _VtxWritePtr += 2;
                }
            }
            else
            {
                // If we're not using a texture, we need the center vertex as well
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = points[i];              _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;       // Center of line
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 0]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col_trans; // Left-side outer edge
                    _VtxWritePtr[2].pos = temp_points[i * 2 + 1]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col_trans; // Right-side outer edge
                    _VtxWritePtr += 3;
                }
            }
        }
        else
        {
            // [PATH 2] Non texture-based lines (thick): we need to draw the solid line core and thus require four vertices per point
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                const int points_last = points_count - 1;
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 0] = points[points_last] + temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 1] = points[points_last] + temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 2] = points[points_last] - temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 3] = points[points_last] - temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : (i1 + 1); // i2 is the second point of the line segment
                const unsigned int idx2 = (i1 + 1) == points_count ? _VtxCurrentIdx : (idx1 + 4); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertices
                ImVec2* out_vtx = &temp_points[i2 * 4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1 + 2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1 + 0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[13] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[14] = (ImDrawIdx)(idx1 + 3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1 + 3); _IdxWritePtr[16] = (ImDrawIdx)(idx2 + 3); _IdxWritePtr[17] = (ImDrawIdx)(idx2 + 2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertices
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i * 4 + 0]; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i * 4 + 1]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i * 4 + 2]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i * 4 + 3]; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // [PATH 4] Non texture-based, Non anti-aliased lines
        const int idx_count = count * 6;
        const int vtx_count = count * 4;    // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + 2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + 2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + 3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}